

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32i386.c
# Opt level: O1

uint8_t i386_reloc_vlink2elf(Reloc *r)

{
  RelocInsert *pRVar1;
  byte bVar2;
  
  pRVar1 = r->insert;
  if ((((pRVar1 != (RelocInsert *)0x0) && (pRVar1->bpos == 0)) && (pRVar1->bsiz == 0x20)) &&
     ((((int)pRVar1->mask == -1 && (pRVar1->next == (RelocInsert *)0x0)) &&
      (bVar2 = r->rtype - 1, bVar2 < 0xf)))) {
    return (&DAT_0012d460)[bVar2];
  }
  return '\0';
}

Assistant:

static uint8_t i386_reloc_vlink2elf(struct Reloc *r)
/* Try to map vlink-internal representation to a valid ELF reloc type */
{
  struct RelocInsert *ri;

  if (ri = r->insert) {
    if (ri->bpos==0 && ri->bsiz==32 &&
        (ri->mask & 0xffffffff)==0xffffffff && ri->next==NULL) {
      switch (r->rtype) {
        case R_ABS: return R_386_32;
        case R_PC: return R_386_PC32;
        case R_GOT: return R_386_GOT32;
        case R_PLT: return R_386_PLT32;
        case R_COPY: return R_386_COPY;
        case R_GLOBDAT: return R_386_GLOB_DAT;
        case R_JMPSLOT: return R_386_JMP_SLOT;
        case R_GOTOFF: return R_386_GOTOFF;
        case R_GOTPC: return R_386_GOTPC;
      }
    }
  }

  return R_NONE;
}